

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

int SMCompatible_Sparse(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix_ID SVar1;
  sunindextype sVar2;
  sunindextype sVar3;
  uint uVar4;
  
  SVar1 = SUNMatGetID(A);
  uVar4 = 0;
  if (SVar1 == SUNMATRIX_SPARSE) {
    SVar1 = SUNMatGetID(B);
    if (SVar1 == SUNMATRIX_SPARSE) {
      sVar2 = SUNSparseMatrix_Rows(A);
      sVar3 = SUNSparseMatrix_Rows(B);
      if (sVar2 == sVar3) {
        sVar2 = SUNSparseMatrix_Columns(A);
        sVar3 = SUNSparseMatrix_Columns(B);
        uVar4 = 0;
        if (sVar2 == sVar3) {
          uVar4 = (uint)(*(int *)((long)A->content + 0x18) == *(int *)((long)B->content + 0x18));
        }
      }
    }
  }
  return uVar4;
}

Assistant:

static booleantype SMCompatible_Sparse(SUNMatrix A, SUNMatrix B)
{
  /* both matrices must be sparse */
  if ( (SUNMatGetID(A) != SUNMATRIX_SPARSE) ||
       (SUNMatGetID(B) != SUNMATRIX_SPARSE) )
    return SUNFALSE;

  /* both matrices must have the same shape and sparsity type */
  if (SUNSparseMatrix_Rows(A) != SUNSparseMatrix_Rows(B))
    return SUNFALSE;
  if (SUNSparseMatrix_Columns(A) != SUNSparseMatrix_Columns(B))
    return SUNFALSE;
  if (SM_SPARSETYPE_S(A) != SM_SPARSETYPE_S(B))
    return SUNFALSE;

  return SUNTRUE;
}